

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::DtlsSession::Write
          (Error *__return_storage_ptr__,DtlsSession *this,ByteArray *aBuf,MessageSubType aSubType)

{
  char cVar1;
  uchar *buf;
  pointer puVar2;
  pointer puVar3;
  uint aMbedtlsError;
  char *pcVar4;
  char *pcVar5;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *extraout_RDX_01;
  ByteArray *aBytes;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  type atVar6 [2];
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  allocator local_e1;
  writer write;
  parse_func p_Stack_d8;
  string local_c0;
  undefined1 local_a0 [40];
  undefined1 local_78 [8];
  string local_70;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *pfStack_50;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if (this->mState == kConnected) {
    ((this->mSocket).super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->mSubType = aSubType;
    buf = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
    aMbedtlsError =
         mbedtls_ssl_write(&this->mSsl,buf,
                           (long)(aBuf->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)buf);
    ((this->mSocket).super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->mSubType = kNone;
    if ((int)aMbedtlsError < 0) {
      ErrorFromMbedtlsError((Error *)local_78,aMbedtlsError);
      Error::operator=(__return_storage_ptr__,(Error *)local_78);
      this_00 = &local_70;
      goto LAB_0016ef1d;
    }
    atVar6[1] = none_type;
    atVar6[0] = aMbedtlsError;
    if ((type  [2])
        ((long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start) == atVar6) {
      std::__cxx11::string::string((string *)local_a0,"dtls",&local_e1);
      local_78._0_4_ = pointer_type;
      local_78._4_4_ = ulong_long_type;
      local_70._M_dataplus._M_p._0_4_ = 0xd;
      local_70._M_string_length = 0x1efc8d;
      local_70.field_2._M_allocated_capacity = 0x30;
      local_70.field_2._8_8_ = (type *)0x300000000;
      local_48 = ::fmt::v10::detail::
                 parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
      pcStack_40 = ::fmt::v10::detail::
                   parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      local_38 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar4 = "session(={}) successfully write data: len={}, {}";
      aBytes = extraout_RDX;
      write.handler_ = (format_string_checker<char> *)local_78;
      pfStack_50 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)local_78;
      while (pcVar4 != "") {
        cVar1 = *pcVar4;
        pcVar5 = pcVar4;
        while (cVar1 != '{') {
          pcVar5 = pcVar5 + 1;
          if (pcVar5 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&write,pcVar4,"");
            aBytes = extraout_RDX_01;
            goto LAB_0016ef4b;
          }
          cVar1 = *pcVar5;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&write,pcVar4,pcVar5);
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,unsigned_long,std::__cxx11::string>&>
                           (pcVar5,"",
                            (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                             *)local_78);
        aBytes = extraout_RDX_00;
      }
LAB_0016ef4b:
      puVar2 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      utils::Hex_abi_cxx11_((string *)&write,(utils *)aBuf,aBytes);
      local_70._M_string_length = (size_type)(puVar3 + -(long)puVar2);
      local_70.field_2._8_8_ = write.handler_;
      pfStack_50 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)p_Stack_d8;
      fmt_00.size_ = 0xd4e;
      fmt_00.data_ = (char *)0x30;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_78;
      local_78 = (undefined1  [8])this;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_c0,(v10 *)"session(={}) successfully write data: len={}, {}",fmt_00,args_01)
      ;
      Log(kDebug,(string *)local_a0,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&write);
      this_00 = (string *)local_a0;
      goto LAB_0016ef1d;
    }
    local_78._0_4_ = int_type;
    local_78._4_4_ = ulong_long_type;
    local_70._M_dataplus._M_p = "written {} bytes of total length {}";
    local_70._M_string_length = 0x23;
    local_70.field_2._M_allocated_capacity = 0x200000000;
    pfStack_50 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)::fmt::v10::detail::
                    parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    local_48 = ::fmt::v10::detail::
               parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    pcVar4 = "written {} bytes of total length {}";
    write.handler_ = (format_string_checker<char> *)local_78;
    local_70.field_2._8_8_ =
         (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_78;
    while (pcVar4 != "") {
      cVar1 = *pcVar4;
      pcVar5 = pcVar4;
      while (cVar1 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>_>
          ::writer::operator()((writer *)&write,pcVar4,"");
          goto LAB_0016eebf;
        }
        cVar1 = *pcVar5;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>_>
      ::writer::operator()((writer *)&write,pcVar4,pcVar5);
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int,unsigned_long>&>
                         (pcVar5,"",
                          (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_78);
    }
LAB_0016eebf:
    local_70._M_string_length =
         (size_type)
         ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_finish +
         -(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start);
    fmt.size_ = 0x41;
    fmt.data_ = (char *)0x23;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_78;
    local_78 = (undefined1  [8])atVar6;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_c0,(v10 *)"written {} bytes of total length {}",fmt,args_00);
    local_a0._0_4_ = kIOBusy;
    std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&local_c0);
  }
  else {
    local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
    local_70._M_dataplus._M_p = "the DTLS session is not connected";
    local_70._M_string_length = 0x21;
    local_70.field_2._M_allocated_capacity = 0;
    pfStack_50 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)0x0;
    pcVar4 = "the DTLS session is not connected";
    write.handler_ = (format_string_checker<char> *)local_78;
    local_70.field_2._8_8_ =
         (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_78;
    while (pcVar4 != "") {
      cVar1 = *pcVar4;
      pcVar5 = pcVar4;
      while (cVar1 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar4,"");
          goto LAB_0016edad;
        }
        cVar1 = *pcVar5;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar4,pcVar5);
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar5,"",(format_string_checker<char> *)local_78);
    }
LAB_0016edad:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_78;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_c0,(v10 *)"the DTLS session is not connected",(string_view)ZEXT816(0x21),args)
    ;
    local_a0._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&local_c0);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_a0);
  std::__cxx11::string::~string((string *)(local_a0 + 8));
  this_00 = &local_c0;
LAB_0016ef1d:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Write(const ByteArray &aBuf, MessageSubType aSubType)
{
    int   rval = 0;
    Error error;

    VerifyOrExit(mState == State::kConnected, error = ERROR_INVALID_STATE("the DTLS session is not connected"));

    mSocket->SetSubType(aSubType);
    rval = mbedtls_ssl_write(&mSsl, &aBuf[0], aBuf.size());
    mSocket->SetSubType(MessageSubType::kNone);

    if (rval >= 0)
    {
        VerifyOrExit(static_cast<size_t>(rval) == aBuf.size(),
                     error = ERROR_IO_BUSY("written {} bytes of total length {}", rval, aBuf.size()));

        LOG_DEBUG(LOG_REGION_DTLS, "session(={}) successfully write data: len={}, {}", static_cast<void *>(this),
                  aBuf.size(), utils::Hex(aBuf));
    }
    else
    {
        error = ErrorFromMbedtlsError(rval);
    }

exit:
    return error;
}